

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralizedMAAStarPlanner.cpp
# Opt level: O1

void __thiscall
GeneralizedMAAStarPlanner::SelectKBestPoliciesToProcessFurther
          (GeneralizedMAAStarPlanner *this,
          shared_ptr<PartialPolicyPoolInterface> *poolOfNextPolicies,bool are_LBs,double bestLB,
          size_t k)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar2;
  undefined3 in_register_00000011;
  ulong uVar3;
  double dVar4;
  PartialPolicyPoolInterface_sharedPtr pp_new;
  PartialPolicyPoolItemInterface_sharedPtr best_ppi;
  long *local_88;
  shared_count local_80;
  long *local_78;
  shared_count sStack_70;
  undefined8 local_68;
  shared_count sStack_60;
  long *local_58;
  shared_count sStack_50;
  undefined8 local_48;
  shared_count sStack_40;
  double local_38;
  
  local_38 = bestLB;
  if (CONCAT31(in_register_00000011,are_LBs) == 0) {
    (*(this->super_TimedAlgorithm)._vptr_TimedAlgorithm[5])(&local_88,this);
    uVar3 = 0;
    while (iVar1 = (*poolOfNextPolicies->px->_vptr_PartialPolicyPoolInterface[0xb])(),
          CONCAT44(extraout_var_01,iVar1) != 0) {
      (*poolOfNextPolicies->px->_vptr_PartialPolicyPoolInterface[6])(&local_78);
      (*poolOfNextPolicies->px->_vptr_PartialPolicyPoolInterface[7])();
      if ((uVar3 < k) && (dVar4 = (double)(**(code **)(*local_78 + 0x18))(), local_38 <= dVar4)) {
        local_58 = local_78;
        sStack_50.pi_ = sStack_70.pi_;
        if (sStack_70.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (sStack_70.pi_)->use_count_ = (sStack_70.pi_)->use_count_ + 1;
          UNLOCK();
        }
        (**(code **)(*local_88 + 0x40))(local_88,&local_58);
        boost::detail::shared_count::~shared_count(&sStack_50);
      }
      uVar3 = uVar3 + 1;
      boost::detail::shared_count::~shared_count(&sStack_70);
    }
    (*poolOfNextPolicies->px->_vptr_PartialPolicyPoolInterface[2])(poolOfNextPolicies->px,local_88);
    while (lVar2 = (**(code **)(*local_88 + 0x58))(), lVar2 != 0) {
      local_68 = 0;
      sStack_60.pi_ = (sp_counted_base *)0x0;
      (**(code **)(*local_88 + 0x28))(local_88,&local_68);
      boost::detail::shared_count::~shared_count(&sStack_60);
    }
    boost::detail::shared_count::~shared_count(&local_80);
  }
  else {
    iVar1 = (*poolOfNextPolicies->px->_vptr_PartialPolicyPoolInterface[0xb])();
    if (CONCAT44(extraout_var,iVar1) != 0) {
      do {
        local_48 = 0;
        sStack_40.pi_ = (sp_counted_base *)0x0;
        (*poolOfNextPolicies->px->_vptr_PartialPolicyPoolInterface[5])
                  (poolOfNextPolicies->px,&local_48);
        boost::detail::shared_count::~shared_count(&sStack_40);
        iVar1 = (*poolOfNextPolicies->px->_vptr_PartialPolicyPoolInterface[0xb])();
      } while (CONCAT44(extraout_var_00,iVar1) != 0);
    }
  }
  return;
}

Assistant:

void 
GeneralizedMAAStarPlanner::SelectKBestPoliciesToProcessFurther(
    const boost::shared_ptr<PartialPolicyPoolInterface> &poolOfNextPolicies, bool are_LBs,
    double bestLB, size_t k)
{
    if(are_LBs)
    {
        //if all policies are full policies, we don't return any
        //of them (these need not be expanded further)
        while(!poolOfNextPolicies->Empty())
            poolOfNextPolicies->Pop();
        return;
    }
    PartialPolicyPoolInterface_sharedPtr pp_new = NewPP();
    
    size_t nr_done = 0;
    while(poolOfNextPolicies->Size() > 0 ) // && nr_done < k) 
    {
        PartialPolicyPoolItemInterface_sharedPtr best_ppi = poolOfNextPolicies->GetBestRanked();
        poolOfNextPolicies->PopBestRanked();
        if(nr_done >= k || best_ppi->GetValue() < bestLB)
        {
            //we do not want this policy, so discard it:
//            delete best_ppi;
        }
        else
        {
            //we do want this policy, so store it:
            pp_new->Insert(best_ppi);
        }
        nr_done++;
    }
    //done: - free the memory of the policies in poolOfNextPolicies
    //that we will not consider further!

    *poolOfNextPolicies = *pp_new;
    //remove elements from pp_new before delete! (otherwise they will be deleted    //with them) and we get a segfault later on...
    while(pp_new->Size() > 0)
        pp_new->Pop();
    
//    delete pp_new;

}